

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionRayleighAdvancedGeneric::ComputeInertiaDampingMatrix
          (ChBeamSectionRayleighAdvancedGeneric *this,ChMatrixNM<double,_6,_6> *Ri,
          ChVector<double> *mW)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *pCVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Scalar local_210;
  Scalar local_208;
  Scalar local_200;
  Scalar local_1f8;
  Scalar local_1f0;
  LhsNested local_1e8;
  undefined8 *puStack_1e0;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *local_1d8;
  undefined1 local_1c0 [16];
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *local_1b0;
  variable_if_dynamic<long,__1> local_1a8;
  variable_if_dynamic<long,__1> local_1a0;
  Index local_198;
  double *local_190 [2];
  scalar_constant_op<double> local_180;
  LhsNested local_178;
  RhsNested local_170;
  RhsNested local_168;
  ChMatrix33<double> mI;
  undefined8 local_108;
  undefined8 local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined1 local_d0 [16];
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_c0;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_78 [48];
  ulong uStack_48;
  double local_40;
  ulong local_38;
  
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)Ri);
  if ((this->super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.
      compute_inertia_damping_matrix != false) {
    if ((this->super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.
        compute_Ri_Ki_by_num_diff == true) {
      ChBeamSectionEuler::ComputeInertiaDampingMatrix((ChBeamSectionEuler *)this,Ri,mW);
      return;
    }
    local_c0.m_xpr = &mI.super_Matrix<double,_3,_3,_1,_3,_3>;
    local_78._0_8_ = 0;
    local_78._24_8_ = mW->m_data[2];
    auVar21._0_8_ = -(double)local_78._24_8_;
    auVar21._8_4_ = 0;
    auVar21._12_4_ = 0x80000000;
    local_78._8_8_ = vmovlps_avx(auVar21);
    local_78._32_8_ = 0.0;
    auVar2 = *(undefined1 (*) [16])mW->m_data;
    local_78._16_8_ = mW->m_data[1];
    local_108 = 0;
    register0x00001248 = auVar2._8_4_;
    local_78._40_8_ = auVar2._0_8_ ^ 0x8000000000000000;
    register0x0000124c = auVar2._12_4_ ^ 0x80000000;
    local_40 = (double)vmovlps_avx(auVar2);
    local_38 = 0;
    auVar2._0_8_ = (this->super_ChBeamSectionEulerAdvancedGeneric).My;
    auVar2._8_8_ = (this->super_ChBeamSectionEulerAdvancedGeneric).Mz;
    dVar1 = (this->super_ChBeamSectionEulerAdvancedGeneric).Mz;
    auVar15._0_8_ = -dVar1;
    auVar15._8_4_ = 0;
    auVar15._12_4_ = 0x80000000;
    auVar27._8_4_ = (int)auVar2._8_8_;
    auVar27._0_8_ = -(double)auVar2._0_8_;
    auVar27._12_4_ = (uint)((ulong)auVar2._8_8_ >> 0x20) ^ 0x80000000;
    local_100 = vmovlps_avx(auVar15);
    local_d0 = ZEXT416((uint)((ulong)auVar15._0_8_ >> 0x20) ^
                       (uint)((ulong)dVar1 >> 0x20) ^ 0x80000000) << 0x20;
    local_e8 = vmovhps_avx(local_d0,0x8000000000000000);
    local_d8 = vmovlps_avx(auVar27);
    mI.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         this->Jyy + this->Jzz;
    local_c0.m_row = 0;
    local_c0.m_col = 1;
    local_c0.m_currentBlockRows = 1;
    local_190[0] = (double *)0x0;
    local_f8 = auVar2;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (&local_c0,(Scalar *)local_190);
    local_1c0._0_8_ = (LhsNested)0x0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar13,(Scalar *)local_1c0);
    local_1e8 = (LhsNested)0x0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar13,(Scalar *)&local_1e8);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (this->super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.JzzJyy_factor;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (this->super_ChBeamSectionEulerAdvancedGeneric).mu;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = this->Jyy;
    auVar14 = vfmadd213sd_fma(auVar22,auVar16,auVar14);
    local_1f0 = auVar14._0_8_;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar13,&local_1f0);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = this->Jyz;
    auVar9._8_8_ = 0x8000000000000000;
    auVar9._0_8_ = 0x8000000000000000;
    auVar14 = vxorpd_avx512vl(auVar17,auVar9);
    local_1f8 = (Scalar)vmovlpd_avx(auVar14);
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar13,&local_1f8);
    local_200 = 0.0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar13,&local_200);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = this->Jyz;
    auVar10._8_8_ = 0x8000000000000000;
    auVar10._0_8_ = 0x8000000000000000;
    auVar14 = vxorpd_avx512vl(auVar18,auVar10);
    local_208 = (Scalar)vmovlpd_avx(auVar14);
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar13,&local_208);
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         (this->super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.JzzJyy_factor;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = (this->super_ChBeamSectionEulerAdvancedGeneric).mu;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->Jzz;
    auVar14 = vfmadd213sd_fma(auVar23,auVar19,auVar3);
    local_210 = auVar14._0_8_;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_(pCVar13,&local_210);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::finished(&local_c0);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar1;
    auVar24 = ZEXT816(0) << 0x40;
    local_c0.m_xpr = (Matrix<double,_3,_3,_1,_3,_3> *)0x0;
    puStack_1e0 = &local_108;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_78._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = (double)auVar2._0_8_ * (double)local_78._8_8_;
    auVar14 = vfmadd231sd_fma(auVar20,auVar24,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_78._24_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = (double)auVar2._0_8_ * (double)local_78._32_8_;
    auVar3 = vfmadd231sd_fma(auVar28,auVar24,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_78._16_8_;
    auVar14 = vfmadd231sd_fma(auVar14,auVar11,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_78._40_8_;
    auVar3 = vfmadd231sd_fma(auVar3,auVar11,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uStack_48;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = (double)auVar2._0_8_ * local_40;
    auVar2 = vfmadd231sd_fma(auVar29,auVar24,auVar8);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_38;
    auVar2 = vfmadd231sd_fma(auVar2,auVar11,auVar24);
    local_c0.m_currentBlockRows = auVar2._0_8_;
    auVar25._0_8_ = local_c0.m_currentBlockRows ^ 0x8000000000000000;
    auVar25._8_8_ = auVar2._8_8_ ^ 0x8000000000000000;
    local_c0.m_row = vmovlpd_avx(auVar25);
    auVar2 = vunpcklpd_avx(auVar14,auVar3);
    local_c0.m_col = auVar3._0_8_;
    local_a0 = 0;
    local_98._8_8_ = auVar2._8_8_ ^ 0x8000000000000000;
    local_98._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
    local_88 = auVar14._0_8_;
    local_80 = 0;
    local_1e8 = (LhsNested)local_78;
    local_1d8 = &local_c0;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                      *)local_190,&(this->super_ChBeamSectionEulerAdvancedGeneric).mu,
                     (StorageBaseType *)&local_1e8);
    local_1c0._0_8_ =
         (Ri->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
         3;
    local_1a8.m_value = 0;
    local_1a0.m_value = 3;
    local_198 = 6;
    local_1b0 = (CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)Ri;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,0>const,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>const>>
              ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false> *)local_1c0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                *)local_190);
    ChMatrix33<double>::operator*(&mI,mW);
    local_c0.m_xpr = (Matrix<double,_3,_3,_1,_3,_3> *)0x0;
    local_1c0._8_8_ = &mI;
    local_190[0] = (Ri->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
                   m_data.array + 0x15;
    auVar26._0_8_ = (ulong)local_1d8 ^ 0x8000000000000000;
    auVar26._8_4_ = 0;
    auVar26._12_4_ = 0x80000000;
    local_c0.m_row = vmovlps_avx(auVar26);
    local_c0.m_currentBlockRows = (Index)local_1d8;
    auVar12._8_8_ = puStack_1e0;
    auVar12._0_8_ = local_1e8;
    local_a0 = 0;
    local_c0.m_col = (Index)puStack_1e0;
    local_98._0_8_ = (ulong)local_1e8 ^ 0x8000000000000000;
    local_98._8_4_ = (int)puStack_1e0;
    local_98._12_4_ = (uint)((ulong)puStack_1e0 >> 0x20) ^ 0x80000000;
    local_88 = vmovlps_avx(auVar12);
    local_80 = 0;
    local_178 = (LhsNested)0x3;
    local_170.m_matrix = (non_const_type)0x3;
    local_168.m_matrix = (non_const_type)0x6;
    local_1c0._0_8_ = (LhsNested)local_78;
    local_1b0 = &local_c0;
    local_180.m_other = (double)Ri;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>>
              ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false> *)local_190,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                *)local_1c0);
  }
  return;
}

Assistant:

void ChBeamSectionRayleighAdvancedGeneric::ComputeInertiaDampingMatrix(ChMatrixNM<double, 6, 6>& Ri,  ///< 6x6 sectional inertial-damping (gyroscopic damping) matrix values here
		const ChVector<>& mW    ///< current angular velocity of section, in material frame
	) {
		Ri.setZero();
		if (compute_inertia_damping_matrix == false) 
			return;
		if (this->compute_Ri_Ki_by_num_diff)
			return ChBeamSectionEuler::ComputeInertiaDampingMatrix(Ri, mW);

		ChStarMatrix33<> wtilde(mW);   // [w~]
		ChVector<> mC(0, this->My, this->Mz);
		ChStarMatrix33<> ctilde(mC);   // [c~]
		ChMatrix33<> mI; 
		mI << this->Jyy+this->Jzz ,										 0,			         			   	    0,
								 0,   this->Jyy + JzzJyy_factor * this->mu,                            -this->Jyz,
								 0,                             -this->Jyz,  this->Jzz + JzzJyy_factor * this->mu;
		//  Ri = [0,  m*[w~][c~]' + m*[([w~]*c)~]'  ; 0 , [w~][I] - [([I]*w)~]  ]
		Ri.block<3, 3>(0, 3) = this->mu * (wtilde * ctilde.transpose() + (ChStarMatrix33<>( wtilde * mC )).transpose() ); 
		Ri.block<3, 3>(3, 3) = wtilde * mI - ChStarMatrix33<>(mI * mW);  
	}